

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O1

void __thiscall
icu_63::LocaleKey::LocaleKey
          (LocaleKey *this,UnicodeString *primaryID,UnicodeString *canonicalPrimaryID,
          UnicodeString *canonicalFallbackID,int32_t kind)

{
  UnicodeString *this_00;
  short sVar1;
  ushort uVar2;
  UBool UVar3;
  int len;
  int32_t iVar4;
  bool bVar5;
  
  ICUServiceKey::ICUServiceKey(&this->super_ICUServiceKey,primaryID);
  (this->super_ICUServiceKey).super_UObject._vptr_UObject = (_func_int **)&PTR__LocaleKey_003c4640;
  this->_kind = kind;
  this_00 = &this->_primaryID;
  UnicodeString::UnicodeString(this_00,canonicalPrimaryID);
  (this->_fallbackID).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003c0258;
  (this->_fallbackID).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->_currentID).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003c0258;
  (this->_currentID).fUnion.fStackFields.fLengthAndFlags = 2;
  UnicodeString::setToBogus(&this->_fallbackID);
  sVar1 = (this->_primaryID).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    len = (this->_primaryID).fUnion.fFields.fLength;
  }
  else {
    len = (int)sVar1 >> 5;
  }
  if ((canonicalFallbackID != (UnicodeString *)0x0) && (len != 0)) {
    uVar2 = (canonicalFallbackID->fUnion).fStackFields.fLengthAndFlags;
    if (((int)sVar1 & 1U) == 0) {
      if ((short)uVar2 < 0) {
        iVar4 = (canonicalFallbackID->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)(short)uVar2 >> 5;
      }
      bVar5 = false;
      if (((uVar2 & 1) == 0) && (len == iVar4)) {
        UVar3 = UnicodeString::doEquals(this_00,canonicalFallbackID,len);
        bVar5 = UVar3 != '\0';
      }
    }
    else {
      bVar5 = (bool)((byte)uVar2 & 1);
    }
    if (bVar5 == false) {
      UnicodeString::operator=(&this->_fallbackID,canonicalFallbackID);
    }
  }
  UnicodeString::operator=(&this->_currentID,this_00);
  return;
}

Assistant:

LocaleKey::LocaleKey(const UnicodeString& primaryID,
                     const UnicodeString& canonicalPrimaryID,
                     const UnicodeString* canonicalFallbackID,
                     int32_t kind)
  : ICUServiceKey(primaryID)
  , _kind(kind)
  , _primaryID(canonicalPrimaryID)
  , _fallbackID()
  , _currentID()
{
    _fallbackID.setToBogus();
    if (_primaryID.length() != 0) {
        if (canonicalFallbackID != NULL && _primaryID != *canonicalFallbackID) {
            _fallbackID = *canonicalFallbackID;
        }
    }

    _currentID = _primaryID;
}